

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassPosition
          (KinDynComputations *this,Span<double,__1L> pos)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_58;
  pointer local_48;
  undefined8 local_40;
  KinDynComputations local_30;
  
  if (pos.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    getCenterOfMassPosition(&local_30);
    local_40 = 3;
    local_58.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = (PointerType)&local_30;
    local_48 = pos.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_48,
               &local_58);
  }
  else {
    iDynTree::reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
  }
  return pos.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassPosition(Span<double> pos)
{
    constexpr int expected_position_size = 3;
    bool ok = pos.size() == expected_position_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassPosition","Wrong size in input pos");
        return false;
    }

    toEigen(pos) = toEigen(getCenterOfMassPosition());

    return true;
}